

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppq.cpp
# Opt level: O3

void __thiscall pg::PPQSolver::solve(PPQSolver *this,int vtop,int pr,int prc,int pe,int po)

{
  ulong *puVar1;
  bitset *this_00;
  bitset *L;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint64_t *puVar5;
  uint64_t *puVar6;
  uint *puVar7;
  int *piVar8;
  Game *pGVar9;
  int *piVar10;
  char cVar11;
  bool bVar12;
  ostream *poVar13;
  long lVar14;
  void *__dest;
  long *plVar15;
  int *piVar16;
  size_t sVar17;
  ulong uVar18;
  uint pl;
  size_t sVar19;
  long lVar20;
  bitset *pbVar21;
  int iVar22;
  int po_00;
  int iVar23;
  ulong uVar24;
  _label_vertex local_58;
  bitset *local_48;
  _label_vertex local_40;
  
  this->iterations = this->iterations + 1;
  if (pe != 0 && po != 0) {
    uVar24 = (ulong)(uint)vtop;
    if (vtop < 0) {
      if (vtop != -1) {
LAB_0015787a:
        iVar23 = (int)uVar24;
        if ((pr & 1U) == 0) {
          iVar22 = pe;
          po_00 = po / 2;
        }
        else {
          iVar22 = pe / 2;
          po_00 = po;
        }
        solve(this,iVar23,pr,prc,iVar22,po_00);
        if (1 < (this->super_Solver).trace) {
          poVar13 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"in pr=",6);
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,pr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,", pe=",5);
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,pe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,", po=",5);
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,po);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," (caller pr=",0xc);
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,prc);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,")",1);
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
        }
        if (iVar23 < 0) {
          if (iVar23 != -1) {
LAB_001579e6:
            iVar23 = (int)uVar24;
            puVar5 = (this->R)._bits;
            sVar17 = (this->R)._bitssize;
            if (sVar17 != 0) {
              memset(puVar5,0,sVar17 << 3);
            }
            puVar6 = (this->L)._bits;
            sVar17 = (this->L)._bitssize;
            if (sVar17 != 0) {
              memset(puVar6,0,sVar17 << 3);
            }
            if (-1 < iVar23) {
              puVar7 = (this->Q).queue;
              piVar16 = this->r;
              uVar18 = uVar24 & 0xffffffff;
              do {
                iVar22 = piVar16[uVar18];
                if (iVar22 != -1) {
                  if (iVar22 == pr) {
                    puVar1 = puVar5 + (uVar18 >> 6);
                    *puVar1 = *puVar1 | 1L << (uVar18 & 0x3f);
                    iVar22 = (this->Q).pointer;
                    (this->Q).pointer = iVar22 + 1;
                    puVar7[iVar22] = (uint)uVar18;
                    iVar22 = piVar16[uVar18];
                  }
                  if (iVar22 <= pr) {
                    puVar1 = puVar6 + (uVar18 >> 6);
                    *puVar1 = *puVar1 | 1L << (uVar18 & 0x3f);
                  }
                }
                bVar12 = 0 < (long)uVar18;
                uVar18 = uVar18 - 1;
              } while (bVar12);
            }
            pl = pr & 1;
            this_00 = &this->R;
            L = &this->L;
            while (iVar22 = (this->Q).pointer, iVar22 != 0) {
              (this->Q).pointer = iVar22 + -1;
              uVar2 = (this->Q).queue[(long)iVar22 + -1];
              this->r[(int)uVar2] = pr;
              attractVertices(this,pl,uVar2,this_00,L,L);
            }
            if (1 < (this->super_Solver).trace) {
              poVar13 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,"\x1b[1;33mregion \x1b[36m",0x13);
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,pr);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[m",3);
              sVar17 = (this->R)._bitssize;
              if (sVar17 != 0) {
                lVar14 = sVar17 * -0x40;
                do {
                  lVar14 = lVar14 + 0x40;
                  if (this_00->_bits[sVar17 - 1] != 0) {
                    lVar20 = LZCOUNT(this_00->_bits[sVar17 - 1]);
                    if (lVar14 - lVar20 != 0x40) {
                      sVar17 = lVar20 - lVar14 ^ 0x3f;
                      do {
                        poVar13 = (this->super_Solver).logger;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13," \x1b[38;5;38m",0xb);
                        local_58.g = (this->super_Solver).game;
                        local_58.v = (int)sVar17;
                        poVar13 = operator<<(poVar13,&local_58);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[m",3);
                        sVar17 = bitset::find_prev(this_00,sVar17);
                      } while (sVar17 != 0xffffffffffffffff);
                    }
                    break;
                  }
                  sVar17 = sVar17 - 1;
                } while (sVar17 != 0);
              }
              poVar13 = (this->super_Solver).logger;
              cVar11 = (char)poVar13;
              std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + cVar11);
              std::ostream::put(cVar11);
              std::ostream::flush();
            }
            bVar12 = maybePromote(this,pr,pl,this_00,L);
            if (!bVar12) {
              uVar18 = (this->R)._bitssize;
              __dest = operator_new__(-(ulong)(uVar18 >> 0x3d != 0) | uVar18 * 8);
              if (uVar18 != 0) {
                memmove(__dest,this_00->_bits,uVar18 * 8);
              }
              if (iVar23 < 0) {
                if (iVar23 != -1) {
                  piVar16 = this->r;
                  uVar18 = uVar24 & 0xffffffff;
LAB_00157cec:
                  uVar3 = piVar16[(int)uVar18];
                  solve(this,iVar23,uVar3,pr,pe,po);
                  if (1 < (this->super_Solver).trace) {
                    poVar13 = (this->super_Solver).logger;
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,"back from recursive ",0x14);
                    poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar3);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar13,", we are pr ",0xc);
                    poVar13 = (ostream *)std::ostream::operator<<(poVar13,pr);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar13,", pe=",5);
                    poVar13 = (ostream *)std::ostream::operator<<(poVar13,pe);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar13,", po=",5);
                    plVar15 = (long *)std::ostream::operator<<(poVar13,po);
                    std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
                    std::ostream::put((char)plVar15);
                    std::ostream::flush();
                  }
                  if (-1 < iVar23) {
                    piVar16 = this->u;
                    piVar8 = this->r;
                    pGVar9 = (this->super_Solver).game;
                    piVar10 = this->str;
                    lVar14 = (uVar24 & 0xffffffff) + 1;
                    do {
                      uVar4 = piVar16[lVar14 + -1];
                      if ((int)uVar4 < pr && uVar4 != 0xffffffff) {
                        if ((uVar4 & 1) == pl) {
LAB_00157e5b:
                          piVar16[lVar14 + -1] = pr;
                        }
                        else {
                          piVar16[lVar14 + -1] = -1;
                          piVar8[lVar14 + -1] = pGVar9->_priority[lVar14 + -1];
                          piVar10[lVar14 + -1] = -1;
                        }
                      }
                      else if (((uVar3 & 1) != pl) &&
                              (piVar8[lVar14 + -1] < pr && piVar8[lVar14 + -1] != -1)) {
                        piVar8[lVar14 + -1] = -1;
                        goto LAB_00157e5b;
                      }
                      lVar20 = lVar14 + -1;
                      bVar12 = 0 < lVar14;
                      lVar14 = lVar20;
                    } while (lVar20 != 0 && bVar12);
                  }
                  if (1 < (this->super_Solver).trace) {
                    poVar13 = (this->super_Solver).logger;
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,"\x1b[1mstate after Und\x1b[m",0x16);
                    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
                    std::ostream::put((char)poVar13);
                    std::ostream::flush();
                    sVar17 = (this->G)._bitssize;
                    if (sVar17 != 0) {
                      local_48 = &this->G;
                      lVar14 = sVar17 * -0x40;
                      do {
                        lVar14 = lVar14 + 0x40;
                        if (local_48->_bits[sVar17 - 1] != 0) {
                          lVar20 = LZCOUNT(local_48->_bits[sVar17 - 1]);
                          if (lVar14 - lVar20 != 0x40) {
                            sVar17 = lVar20 - lVar14 ^ 0x3f;
                            do {
                              local_58.g = (this->super_Solver).game;
                              local_58.v = (int)sVar17;
                              poVar13 = operator<<((this->super_Solver).logger,&local_58);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar13," r=",3);
                              poVar13 = (ostream *)std::ostream::operator<<(poVar13,this->r[sVar17])
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar13," u=",3);
                              poVar13 = (ostream *)std::ostream::operator<<(poVar13,this->u[sVar17])
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar13," str=",5);
                              local_40.g = (this->super_Solver).game;
                              local_40.v = this->str[sVar17];
                              poVar13 = operator<<(poVar13,&local_40);
                              std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13
                                             );
                              std::ostream::put((char)poVar13);
                              std::ostream::flush();
                              sVar17 = bitset::find_prev(local_48,sVar17);
                            } while (sVar17 != 0xffffffffffffffff);
                          }
                          break;
                        }
                        sVar17 = sVar17 - 1;
                      } while (sVar17 != 0);
                    }
                  }
                  puVar5 = (this->R)._bits;
                  sVar17 = (this->R)._bitssize;
                  if (sVar17 != 0) {
                    memset(puVar5,0,sVar17 << 3);
                  }
                  puVar6 = (this->L)._bits;
                  sVar17 = (this->L)._bitssize;
                  if (sVar17 != 0) {
                    memset(puVar6,0,sVar17 << 3);
                  }
                  pbVar21 = (bitset *)(this->U)._bits;
                  sVar17 = (this->U)._bitssize;
                  if (sVar17 != 0) {
                    local_48 = pbVar21;
                    memset(pbVar21,0,sVar17 << 3);
                    pbVar21 = local_48;
                  }
                  if (-1 < iVar23) {
                    puVar7 = (this->Q).queue;
                    piVar16 = this->r;
                    piVar8 = this->u;
                    uVar18 = uVar24 & 0xffffffff;
                    do {
                      iVar22 = piVar16[uVar18];
                      if (iVar22 == pr) {
                        puVar1 = puVar5 + (uVar18 >> 6);
                        *puVar1 = *puVar1 | 1L << (uVar18 & 0x3f);
                      }
                      if (iVar22 <= pr && iVar22 != -1) {
                        puVar1 = puVar6 + (uVar18 >> 6);
                        *puVar1 = *puVar1 | 1L << (uVar18 & 0x3f);
                      }
                      if (piVar8[uVar18] == pr) {
                        (&pbVar21->_bits)[uVar18 >> 6] =
                             (uint64_t *)
                             ((ulong)(&pbVar21->_bits)[uVar18 >> 6] | 1L << (uVar18 & 0x3f));
                        iVar22 = (this->Q).pointer;
                        (this->Q).pointer = iVar22 + 1;
                        puVar7[iVar22] = (uint)uVar18;
                      }
                      bVar12 = 0 < (long)uVar18;
                      uVar18 = uVar18 - 1;
                    } while (bVar12);
                  }
                  pbVar21 = &this->U;
                  while( true ) {
                    iVar22 = (this->Q).pointer;
                    if ((long)iVar22 == 0) break;
                    (this->Q).pointer = iVar22 + -1;
                    uVar2 = (this->Q).queue[(long)iVar22 + -1];
                    this->u[(int)uVar2] = pr;
                    this->r[(int)uVar2] = -1;
                    attractVertices(this,pl ^ 1,uVar2,pbVar21,L,L);
                  }
                  sVar17 = (this->R)._bitssize;
                  if (sVar17 != 0) {
                    puVar5 = pbVar21->_bits;
                    sVar19 = 0;
                    puVar6 = this_00->_bits;
                    do {
                      puVar6[sVar19] = puVar6[sVar19] & ~puVar5[sVar19];
                      sVar19 = sVar19 + 1;
                    } while (sVar17 != sVar19);
                  }
                  sVar17 = (this->L)._bitssize;
                  if (sVar17 != 0) {
                    puVar5 = pbVar21->_bits;
                    puVar6 = L->_bits;
                    sVar19 = 0;
                    do {
                      puVar6[sVar19] = puVar6[sVar19] & ~puVar5[sVar19];
                      sVar19 = sVar19 + 1;
                    } while (sVar17 != sVar19);
                  }
                  sVar17 = (this->R)._bitssize;
                  if (sVar17 != 0) {
                    sVar19 = 0;
                    puVar5 = this_00->_bits;
                    do {
                      puVar5[sVar19] = puVar5[sVar19] | *(ulong *)((long)__dest + sVar19 * 8);
                      sVar19 = sVar19 + 1;
                    } while (sVar17 != sVar19);
                  }
                  sVar17 = bitset::find_first(this_00);
LAB_001581f5:
                  if (sVar17 == 0xffffffffffffffff) {
                    maybePromote(this,pr,pl,this_00,L);
                  }
                  else {
                    uVar3 = this->r[sVar17];
                    if (((uVar3 != 0xffffffff) && ((int)uVar3 <= pr || (uVar3 & 1) == pl)) &&
                       (((long)this->str[sVar17] == -1 || (this->r[this->str[sVar17]] == pr))))
                    goto LAB_00158235;
                    if (iVar23 < 0) goto LAB_00158380;
                    uVar18 = uVar24 & 0xffffffff;
                    do {
                      piVar16 = this->r;
                      if (piVar16[uVar18] <= pr && piVar16[uVar18] != -1) {
                        if (1 < (this->super_Solver).trace) {
                          poVar13 = (this->super_Solver).logger;
                          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"reset ",6);
                          local_58.g = (this->super_Solver).game;
                          local_58.v = (int)uVar18;
                          poVar13 = operator<<(poVar13,&local_58);
                          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
                          std::ostream::put((char)poVar13);
                          std::ostream::flush();
                          piVar16 = this->r;
                        }
                        piVar16[uVar18] = ((this->super_Solver).game)->_priority[uVar18];
                        this->u[uVar18] = -1;
                        this->str[uVar18] = -1;
                      }
                      bVar12 = 0 < (long)uVar18;
                      uVar18 = uVar18 - 1;
                    } while (bVar12);
                    if (iVar23 < 0) {
LAB_00158380:
                      if (iVar23 != -1) goto LAB_00158386;
                    }
                    else {
                      uVar24 = uVar24 & 0xffffffff;
                      do {
                        if (((((this->G)._bits[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0) &&
                            (this->r[uVar24] <= pr)) && (this->u[uVar24] <= pr)) {
                          iVar23 = (int)uVar24;
LAB_00158386:
                          if (pl == 0) {
                            po = po / 2;
                          }
                          else {
                            pe = pe / 2;
                          }
                          solve(this,iVar23,pr,prc,pe,po);
                          break;
                        }
                        bVar12 = 0 < (long)uVar24;
                        uVar24 = uVar24 - 1;
                      } while (bVar12);
                    }
                  }
                }
              }
              else {
                piVar16 = this->r;
                uVar18 = uVar24 & 0xffffffff;
                do {
                  if (((((this->G)._bits[uVar18 >> 6] >> (uVar18 & 0x3f) & 1) != 0) &&
                      (piVar16[uVar18] < pr)) && (this->u[uVar18] < pr)) goto LAB_00157cec;
                  bVar12 = 0 < (long)uVar18;
                  uVar18 = uVar18 - 1;
                } while (bVar12);
              }
              operator_delete__(__dest);
            }
          }
        }
        else {
          uVar24 = uVar24 & 0xffffffff;
          do {
            if (((((this->G)._bits[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0) &&
                (this->r[uVar24] <= pr)) && (this->u[uVar24] <= pr)) goto LAB_001579e6;
            bVar12 = 0 < (long)uVar24;
            uVar24 = uVar24 - 1;
          } while (bVar12);
        }
      }
    }
    else {
      do {
        if (((((this->G)._bits[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0) && (this->r[uVar24] <= pr)
            ) && (this->u[uVar24] <= pr)) goto LAB_0015787a;
        bVar12 = 0 < (long)uVar24;
        uVar24 = uVar24 - 1;
      } while (bVar12);
    }
  }
  return;
LAB_00158235:
  sVar17 = bitset::find_next(this_00,sVar17);
  goto LAB_001581f5;
}

Assistant:

void
PPQSolver::solve(int vtop, const int pr, const int prc, const int pe, const int po)
{
    // track the number of visits
    iterations++;

    // no state change
    if (po == 0 || pe == 0) return;

    // move vtop to the true top, then check for game emptiness
    while (vtop >= 0 and (!G[vtop] or r[vtop] > pr or u[vtop] > pr)) vtop--;
    if (vtop == -1) return; // empty game, bye

    // const int pr = r[vtop]; // set to highest priority
    const int pl = pr&1;

    // Expand the left side of the current level of the universal tree
    // This is where we use Lehtinen's version, not Pawel's.
    if (pl == 0) solve(vtop, pr, prc, pe, po/2);
    else solve(vtop, pr, prc, pe/2, po);

#ifndef NDEBUG
    if (trace >= 2) logger << "in pr=" << pr << ", pe=" << pe << ", po=" << po << " (caller pr=" << prc << ")" << std::endl;
#endif

    // after the left side, a lot can be changed, find our new vtop

    while (vtop >= 0 and (!G[vtop] or r[vtop] > pr or u[vtop] > pr)) vtop--;
    if (vtop == -1) return; // empty game, bye

    // TODO handle some special cases: entire region in u; nothing left in r; L is smaller than pe/po

    // set R := all vertices with r[v] == pr
    // set L := all vertices with r[v] <= pr and r[v] != -1
    // also add each vertex in R to the attract queue Q

    R.reset();
    L.reset();
    for (int v = vtop; v >= 0; v--) {
        // assumption: if v not in G, then r[v] == -1
        if (r[v] != -1) {
            if (r[v] == pr) {
                R[v] = true; // add to R
                Q.push(v);   // add to Q
            } 
            if (r[v] <= pr) {
                L[v] = true; // add to L
            }
        }
    } 

    // Attract for pl from L to R

    while (Q.nonempty()) {
        int v = Q.pop();
        r[v] = pr;    // set r ; we already know/assume that u[v] == -1
        // L[v] = false; // remove from L
        attractVertices(pl, v, R, L, L);
    }

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "\033[1;33mregion \033[36m" << pr << "\033[m";
        for (auto v = R.find_last(); v != bitset::npos; v = R.find_prev(v)) {
            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m"; 
        }
        logger << std::endl;
    }
#endif

    // Now that we have our R, check if it is closed.
    // Simultaneously find lowest escape out of R (for the opponent)

    bool promoted = maybePromote(pr, pl, R, L);

    // if promoted, we don't need to consider the recursive game (according to the paper)
    if (promoted) return;

    // if (promoted) R.reset(); // alternative...

    /** /
    // optimization to not continue if we can be sure that the recursion already took all
    // possible opponent's small dominions
    //
    // sadly, this does not work well with the PP optimization
    L -= R;
    unsigned long count = L.count(); // what remains ?
    if (pl) {
        if (count <= (po/2)) return;
    } else {
        if (count <= (pe/2)) return;
    }
    // */

    // make a local copy of R, because R/L can be destroyed in the recursion
    bitset Z(R);

    // compute next vtop (for subgame) and the next priority
    int next_vtop = vtop;
    while (next_vtop >= 0 and (!G[next_vtop] or r[next_vtop] >= pr or u[next_vtop] >= pr)) next_vtop--;
    if (next_vtop == -1) return; // subgame is actually empty
    const int subpr = r[next_vtop];

    // run recursively
    solve(vtop, subpr, pr, pe, po);

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "back from recursive " << subpr << ", we are pr " << pr << ", pe=" << pe << ", po=" << po << std::endl;
    }
#endif

    // Now we must first perform Und
    // There may be a lower u. If same pl pr, then merge with our u. If different pl pr, reset.
    // There may be a lower r. If other pl, then merge to our u

    for (int v = vtop; v >= 0; v--) {
        if (u[v] != -1 and u[v] < pr) {
            // lower u
            if ((u[v]&1) == pl) {
                // same pl pr, so merge
                u[v] = pr;
            } else {
                // other pl pr, so reset
                u[v] = -1;
                r[v] = priority(v);
                str[v] = -1;
            }
        } else if ((subpr&1)!=pl and r[v] != -1 and r[v] < pr) {
            // it's a lower other pl r, merge to our u
            r[v] = -1;
            u[v] = pr;
        }
    }

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "\033[1mstate after Und\033[m" << std::endl;
        for (auto v = G.find_last(); v != bitset::npos; v = G.find_prev(v)) {
            logger << label_vertex(v) << " r=" << r[v] << " u=" << u[v] << " str=" << label_vertex(str[v]) << std::endl;
        }
    }
#endif

    // after the recursion, R/U/L could be anything...
    // set R := all vertices with r[v] == pr
    // set U := all vertices with u[v] == pr
    // set L := all vertices with r[v] <= pr
    // also add each vertex in U to the attract queue Q

    R.reset();  
    L.reset();
    U.reset();
    for (int v = vtop; v >= 0; v--) {
        if (r[v] == pr) {
            R[v] = true; // add to R
        }
        if (r[v] != -1 && r[v] <= pr) {
            L[v] = true; // add to L
        }
        if (u[v] == pr) {
            U[v] = true; // add to U
            Q.push(v);   // add to Q for attracting from R/L to U
        }
    } 

    // Attract to U from L
    while (Q.nonempty()) {
        int v = Q.pop();
        u[v] = pr;
        r[v] = -1;
        attractVertices(1-pl, v, U, L, L);
    }

    // Update R and L
    R -= U;
    L -= U;

    // Add original R to current R in order to check if we need to reset R
    R |= Z;

    // check if we need to reset the region
    bool reset_R = false;
    for (auto v = R.find_first(); v != bitset::npos; v = R.find_next(v)) {
        // check if a vertex is now in a dominion or in u
        if (r[v] == -1) {
            reset_R = true; // either dominion or in u
            break;
        }
        // check if a vertex is in a higher opponent r
        if (r[v] > pr && (r[v]&1) != pl) {
            reset_R = true;
            break;
        }
        // check if a strategy leaves R
        if (str[v] != -1 && r[str[v]] != pr) {
            reset_R = true;
            break;
        }
    }

    if (reset_R) {
        // reset everything with r <= pr
        for (auto v = vtop; v >= 0; v--) {
            if (r[v] != -1 && r[v] <= pr) {
#ifndef NDEBUG
                if (trace >= 2) logger << "reset " << label_vertex(v) << std::endl;
#endif
                r[v] = priority(v);
                u[v] = -1;
                str[v] = -1;
            }
        }
    } else {
        // we did not reset, try to promote again
        maybePromote(pr, pl, R, L);
        // regardless of the outcome, if nothing reset, no need to go recursive again
        return;
    }

    // move vtop then expand right side of the universal tree
    while (vtop >= 0 and (!G[vtop] or r[vtop] > pr or u[vtop] > pr)) vtop--;
    if (vtop == -1) return; // and we're done, there's nothing left

    // Expand the right side of the current level of the universal tree
    if (pl == 0) solve(vtop, pr, prc, pe, po/2);
    else solve(vtop, pr, prc, pe/2, po);
}